

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall ImDrawListSharedData::ImDrawListSharedData(ImDrawListSharedData *this)

{
  int i;
  long lVar1;
  float fVar2;
  float fVar3;
  
  lVar1 = 0;
  memset(this,0,0xd8);
  do {
    fVar2 = (((float)(int)lVar1 + (float)(int)lVar1) * 3.1415927) / 12.0;
    fVar3 = cosf(fVar2);
    fVar2 = sinf(fVar2);
    this->ArcFastVtx[lVar1].x = fVar3;
    this->ArcFastVtx[lVar1].y = fVar2;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0xc);
  return;
}

Assistant:

ImDrawListSharedData::ImDrawListSharedData()
{
    memset(this, 0, sizeof(*this));
    for (int i = 0; i < IM_ARRAYSIZE(ArcFastVtx); i++)
    {
        const float a = ((float)i * 2 * IM_PI) / (float)IM_ARRAYSIZE(ArcFastVtx);
        ArcFastVtx[i] = ImVec2(ImCos(a), ImSin(a));
    }
}